

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

void kj::_::anon_unknown_0::DelocalizeRadix(char *buffer)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  char *target;
  char *buffer_local;
  
  pcVar3 = strchr(buffer,0x2e);
  target = buffer;
  if (pcVar3 == (char *)0x0) {
    while (bVar1 = IsValidFloatChar(*target), bVar1) {
      target = target + 1;
    }
    if (*target != '\0') {
      *target = '.';
      pcVar3 = target + 1;
      bVar1 = IsValidFloatChar(*pcVar3);
      if ((!bVar1) && (target = pcVar3, *pcVar3 != '\0')) {
        do {
          target = target + 1;
          bVar2 = IsValidFloatChar(*target);
          bVar1 = false;
          if (!bVar2) {
            bVar1 = *target != '\0';
          }
        } while (bVar1);
        sVar4 = strlen(target);
        memmove(pcVar3,target,sVar4 + 1);
      }
    }
  }
  return;
}

Assistant:

void DelocalizeRadix(char* buffer) {
  // Fast check:  if the buffer has a normal decimal point, assume no
  // translation is needed.
  if (strchr(buffer, '.') != NULL) return;

  // Find the first unknown character.
  while (IsValidFloatChar(*buffer)) ++buffer;

  if (*buffer == '\0') {
    // No radix character found.
    return;
  }

  // We are now pointing at the locale-specific radix character.  Replace it
  // with '.'.
  *buffer = '.';
  ++buffer;

  if (!IsValidFloatChar(*buffer) && *buffer != '\0') {
    // It appears the radix was a multi-byte character.  We need to remove the
    // extra bytes.
    char* target = buffer;
    do { ++buffer; } while (!IsValidFloatChar(*buffer) && *buffer != '\0');
    memmove(target, buffer, strlen(buffer) + 1);
  }
}